

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,t_label *a_label)

{
  t_emit *ptVar1;
  size_t local_20;
  t_label *local_18;
  t_label *a_label_local;
  t_emit *this_local;
  
  local_18 = a_label;
  a_label_local = (t_label *)this;
  local_20 = f_last(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&a_label->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&local_20);
  ptVar1 = operator<<(this,0);
  return ptVar1;
}

Assistant:

t_emit& operator<<(t_label& a_label)
	{
		a_label.push_back(f_last());
		return *this << size_t(0);
	}